

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_gramma_analysis.cpp
# Opt level: O0

compile_errcode __thiscall FunctionCall::Parse(FunctionCall *this)

{
  LogTools *log_tools_ptr;
  compile_errcode cVar1;
  allocator local_49;
  string local_48;
  SymbolName local_24;
  int local_20;
  SymbolName name;
  int state;
  int ret;
  FunctionCall *this_local;
  
  name = WHILE_SYM;
  local_20 = 0;
  _state = this;
  do {
    local_24 = SymbolQueue::GetCurrentName(handle_symbol_queue);
    log_tools_ptr = g_log_tools;
    switch(local_20) {
    case 0:
      if (local_24 != IDENTIFIER_SYM) {
        return -1;
      }
      local_20 = 1;
      break;
    case 1:
      if (local_24 != L_CIRCLE_BRACKET_SYM) {
        return -1;
      }
      local_20 = 2;
      break;
    case 2:
      cVar1 = ValueArgumentList::Parse(&this->m_value_argument_list);
      if (cVar1 != 0) {
        return -1;
      }
      local_20 = 3;
      name = WHILE_SYM;
      break;
    case 3:
      if (local_24 != R_CIRCLE_BRACKET_SYM) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_48,"expected a \')\' in function call",&local_49);
        GrammaErrorLogs(log_tools_ptr,&local_48);
        std::__cxx11::string::~string((string *)&local_48);
        std::allocator<char>::~allocator((allocator<char> *)&local_49);
        return -1;
      }
      local_20 = 4;
      break;
    case 4:
      return 0;
    }
    if (local_20 != 3) {
      SymbolQueue::NextSymbol(handle_symbol_queue);
    }
  } while( true );
}

Assistant:

compile_errcode FunctionCall::Parse() {
    int ret = COMPILE_OK;
    int state = 0;
    while (true) {
        SymbolName name = handle_symbol_queue->GetCurrentName();
        switch (state) {
            case 0: {
                if (name == IDENTIFIER_SYM) {
                    state = 1;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 1: {
                if (name == L_CIRCLE_BRACKET_SYM) {
                    state = 2;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 2: {
                if ((ret = m_value_argument_list.Parse()) == COMPILE_OK) {
                    state = 3;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 3: {
                if (name == R_CIRCLE_BRACKET_SYM) {
                    state = 4;
                    break;
                } else {
                    GrammaErrorLogs(g_log_tools, "expected a ')' in function call");
                    return NOT_MATCH;
                }
            }
            case 4: return COMPILE_OK;
        }
        if (state != 3)
            handle_symbol_queue->NextSymbol();
    }
}